

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLPrinter::CloseElement(XMLPrinter *this,bool compactMode)

{
  int iVar1;
  size_t size;
  size_t size_00;
  char *pcVar2;
  
  this->_depth = this->_depth + -1;
  iVar1 = (this->_stack)._size;
  (this->_stack)._size = iVar1 + -1;
  if (this->_elementJustOpened == true) {
    pcVar2 = "/>";
    size_00 = 2;
  }
  else {
    pcVar2 = (this->_stack)._mem[(long)iVar1 + -1];
    if (this->_textDepth < 0 && !compactMode) {
      Putc(this,'\n');
      (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xc])(this,(ulong)(uint)this->_depth);
    }
    Write(this,"</",2);
    size = strlen(pcVar2);
    Write(this,pcVar2,size);
    pcVar2 = ">";
    size_00 = 1;
  }
  Write(this,pcVar2,size_00);
  if (this->_textDepth == this->_depth) {
    this->_textDepth = -1;
  }
  if (this->_depth == 0 && !compactMode) {
    Putc(this,'\n');
  }
  this->_elementJustOpened = false;
  return;
}

Assistant:

void XMLPrinter::CloseElement( bool compactMode )
{
    --_depth;
    const char* name = _stack.Pop();

    if ( _elementJustOpened ) {
        Write( "/>" );
    }
    else {
        if ( _textDepth < 0 && !compactMode) {
            Putc( '\n' );
            PrintSpace( _depth );
        }
        Write ( "</" );
        Write ( name );
        Write ( ">" );
    }

    if ( _textDepth == _depth ) {
        _textDepth = -1;
    }
    if ( _depth == 0 && !compactMode) {
        Putc( '\n' );
    }
    _elementJustOpened = false;
}